

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

curl_socket_t Curl_getconnectinfo(Curl_easy *data,connectdata **connp)

{
  connectdata *pcVar1;
  connectdata *conn;
  connectdata **connp_local;
  Curl_easy *data_local;
  
  if ((data->state).lastconnect_id == -1) {
    data_local._4_4_ = -1;
  }
  else {
    pcVar1 = Curl_cpool_get_conn(data,(data->state).lastconnect_id);
    if (pcVar1 == (connectdata *)0x0) {
      (data->state).lastconnect_id = -1;
      data_local._4_4_ = -1;
    }
    else {
      if (connp != (connectdata **)0x0) {
        *connp = pcVar1;
      }
      data_local._4_4_ = pcVar1->sock[0];
    }
  }
  return data_local._4_4_;
}

Assistant:

curl_socket_t Curl_getconnectinfo(struct Curl_easy *data,
                                  struct connectdata **connp)
{
  DEBUGASSERT(data);

  /* this works for an easy handle:
   * - that has been used for curl_easy_perform()
   * - that is associated with a multi handle, and whose connection
   *   was detached with CURLOPT_CONNECT_ONLY
   */
  if(data->state.lastconnect_id != -1) {
    struct connectdata *conn;

    conn = Curl_cpool_get_conn(data, data->state.lastconnect_id);
    if(!conn) {
      data->state.lastconnect_id = -1;
      return CURL_SOCKET_BAD;
    }

    if(connp)
      /* only store this if the caller cares for it */
      *connp = conn;
    return conn->sock[FIRSTSOCKET];
  }
  return CURL_SOCKET_BAD;
}